

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::updateDual(HDual *this)

{
  double theta;
  int iCol;
  double *pdVar1;
  HDualRow *this_00;
  long lVar2;
  
  if (this->invertHint == 0) {
    theta = this->thetaDual;
    if ((theta != 0.0) || (NAN(theta))) {
      HDualRow::update_dual(&this->dualRow,theta);
      if ((this->dual_variant != 0) && ((this->slice_PRICE != 0 && (0 < this->slice_num)))) {
        this_00 = this->slice_dualRow;
        lVar2 = 0;
        do {
          HDualRow::update_dual(this_00,this->thetaDual);
          lVar2 = lVar2 + 1;
          this_00 = this_00 + 1;
        } while (lVar2 < this->slice_num);
      }
    }
    else {
      HModel::shiftCost(this->model,this->columnIn,-this->workDual[this->columnIn]);
    }
    pdVar1 = this->workDual;
    pdVar1[this->columnIn] = 0.0;
    iCol = this->columnOut;
    pdVar1[iCol] = -this->thetaDual;
    HModel::shiftBack(this->model,iCol);
    return;
  }
  return;
}

Assistant:

void HDual::updateDual() {
	if (invertHint)
		return;

	// Update - dual (shift and back)
	if (thetaDual == 0)
		model->shiftCost(columnIn, -workDual[columnIn]);
	else {
		dualRow.update_dual(thetaDual);
		if (dual_variant != HDUAL_VARIANT_PLAIN && slice_PRICE)
			for (int i = 0; i < slice_num; i++)
				slice_dualRow[i].update_dual(thetaDual);
	}
	workDual[columnIn] = 0;
	workDual[columnOut] = -thetaDual;
	model->shiftBack(columnOut);
}